

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationDataBuilder::buildContext
          (CollationDataBuilder *this,ConditionalCE32 *head,UErrorCode *errorCode)

{
  Normalizer2Impl *pNVar1;
  ConditionalCE32 *pCVar2;
  ConditionalCE32 *pCVar3;
  UBool UVar4;
  uint16_t uVar5;
  int srcStart;
  int32_t iVar6;
  UChar32 UVar7;
  uint32_t uVar8;
  ConditionalCE32 *pCVar9;
  bool bVar10;
  int32_t index;
  int32_t index_1;
  undefined1 local_1d0 [6];
  uint16_t fcd16;
  UnicodeString suffix;
  uint local_188;
  int32_t length;
  uint32_t flags;
  uint32_t emptySuffixCE32;
  int32_t suffixStart;
  uint32_t ce32;
  ConditionalCE32 *lastCond;
  ConditionalCE32 *firstCond;
  UnicodeString prefix;
  ConditionalCE32 *pCStack_120;
  int32_t prefixLength;
  ConditionalCE32 *cond;
  undefined1 local_108 [8];
  UCharsTrieBuilder contractionBuilder;
  UCharsTrieBuilder prefixBuilder;
  UErrorCode *errorCode_local;
  ConditionalCE32 *head_local;
  CollationDataBuilder *this_local;
  
  UVar4 = ::U_FAILURE(*errorCode);
  if (UVar4 != '\0') {
    return 0;
  }
  UCharsTrieBuilder::UCharsTrieBuilder
            ((UCharsTrieBuilder *)&contractionBuilder.ucharsCapacity,errorCode);
  UCharsTrieBuilder::UCharsTrieBuilder((UCharsTrieBuilder *)local_108,errorCode);
  pCStack_120 = head;
  do {
    pCVar2 = pCStack_120;
    prefix.fUnion._52_4_ = ConditionalCE32::prefixLength(pCStack_120);
    UnicodeString::UnicodeString
              ((UnicodeString *)&firstCond,&pCStack_120->context,0,prefix.fUnion._52_4_ + 1);
    do {
      pCVar3 = pCStack_120;
      bVar10 = false;
      if (-1 < pCStack_120->next) {
        pCStack_120 = getConditionalCE32(this,pCStack_120->next);
        UVar4 = UnicodeString::startsWith(&pCStack_120->context,(UnicodeString *)&firstCond);
        bVar10 = UVar4 != '\0';
      }
    } while (bVar10);
    srcStart = prefix.fUnion._52_4_ + 1;
    iVar6 = UnicodeString::length(&pCVar3->context);
    if (iVar6 == srcStart) {
      emptySuffixCE32 = pCVar3->ce32;
      pCStack_120 = pCVar3;
LAB_00287692:
      pCVar2->defaultCE32 = emptySuffixCE32;
      if (prefix.fUnion._52_4_ == 0) {
        if (pCStack_120->next < 0) {
          this_local._4_4_ = emptySuffixCE32;
          index = 1;
        }
        else {
LAB_0028772c:
          index = 0;
        }
      }
      else {
        UnicodeString::remove((UnicodeString *)&firstCond,(char *)0x0);
        UnicodeString::reverse((UnicodeString *)&firstCond);
        UCharsTrieBuilder::add
                  ((UCharsTrieBuilder *)&contractionBuilder.ucharsCapacity,
                   (UnicodeString *)&firstCond,emptySuffixCE32,errorCode);
        if (-1 < pCStack_120->next) goto LAB_0028772c;
        index = 2;
      }
    }
    else {
      UCharsTrieBuilder::clear((UCharsTrieBuilder *)local_108);
      length = 0;
      local_188 = 0;
      iVar6 = UnicodeString::length(&pCVar2->context);
      if (iVar6 == srcStart) {
        length = pCVar2->ce32;
        pCVar9 = getConditionalCE32(this,pCVar2->next);
      }
      else {
        local_188 = 0x100;
        pCStack_120 = head;
        while (suffix.fUnion._52_4_ = ConditionalCE32::prefixLength(pCStack_120), pCVar9 = pCVar2,
              suffix.fUnion._52_4_ != prefix.fUnion._52_4_) {
          if ((pCStack_120->defaultCE32 != 1) &&
             ((suffix.fUnion._52_4_ == 0 ||
              (UVar4 = UnicodeString::endsWith
                                 ((UnicodeString *)&firstCond,&pCStack_120->context,1,
                                  suffix.fUnion._52_4_), UVar4 != '\0')))) {
            length = pCStack_120->defaultCE32;
          }
          pCStack_120 = getConditionalCE32(this,pCStack_120->next);
        }
      }
      pCStack_120 = pCVar9;
      local_188 = local_188 | 0x200;
      do {
        UnicodeString::UnicodeString((UnicodeString *)local_1d0,&pCStack_120->context,srcStart);
        pNVar1 = this->nfcImpl;
        UVar7 = UnicodeString::char32At((UnicodeString *)local_1d0,0);
        uVar5 = Normalizer2Impl::getFCD16(pNVar1,UVar7);
        if (uVar5 < 0x100) {
          local_188 = local_188 & 0xfffffdff;
        }
        pNVar1 = this->nfcImpl;
        iVar6 = UnicodeString::length((UnicodeString *)local_1d0);
        UVar7 = UnicodeString::char32At((UnicodeString *)local_1d0,iVar6 + -1);
        uVar5 = Normalizer2Impl::getFCD16(pNVar1,UVar7);
        if (0xff < uVar5) {
          local_188 = local_188 | 0x400;
        }
        UCharsTrieBuilder::add
                  ((UCharsTrieBuilder *)local_108,(UnicodeString *)local_1d0,pCStack_120->ce32,
                   errorCode);
        if (pCStack_120 == pCVar3) {
          index = 10;
        }
        else {
          pCStack_120 = getConditionalCE32(this,pCStack_120->next);
          index = 0;
        }
        UnicodeString::~UnicodeString((UnicodeString *)local_1d0);
      } while (index == 0);
      iVar6 = addContextTrie(this,length,(UCharsTrieBuilder *)local_108,errorCode);
      UVar4 = ::U_FAILURE(*errorCode);
      if (UVar4 == '\0') {
        if (iVar6 < 0x80000) {
          uVar8 = Collation::makeCE32FromTagAndIndex(9,iVar6);
          emptySuffixCE32 = uVar8 | local_188;
          goto LAB_00287692;
        }
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
        this_local._4_4_ = 0;
        index = 1;
      }
      else {
        this_local._4_4_ = 0;
        index = 1;
      }
    }
    UnicodeString::~UnicodeString((UnicodeString *)&firstCond);
    if (index != 0) {
      if (index == 2) {
        iVar6 = addContextTrie(this,head->defaultCE32,
                               (UCharsTrieBuilder *)&contractionBuilder.ucharsCapacity,errorCode);
        UVar4 = ::U_FAILURE(*errorCode);
        if (UVar4 == '\0') {
          if (iVar6 < 0x80000) {
            this_local._4_4_ = Collation::makeCE32FromTagAndIndex(8,iVar6);
          }
          else {
            *errorCode = U_BUFFER_OVERFLOW_ERROR;
            this_local._4_4_ = 0;
          }
        }
        else {
          this_local._4_4_ = 0;
        }
      }
      UCharsTrieBuilder::~UCharsTrieBuilder((UCharsTrieBuilder *)local_108);
      UCharsTrieBuilder::~UCharsTrieBuilder((UCharsTrieBuilder *)&contractionBuilder.ucharsCapacity)
      ;
      return this_local._4_4_;
    }
    pCStack_120 = getConditionalCE32(this,pCStack_120->next);
  } while( true );
}

Assistant:

uint32_t
CollationDataBuilder::buildContext(ConditionalCE32 *head, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // The list head must have no context.
    U_ASSERT(!head->hasContext());
    // The list head must be followed by one or more nodes that all do have context.
    U_ASSERT(head->next >= 0);
    UCharsTrieBuilder prefixBuilder(errorCode);
    UCharsTrieBuilder contractionBuilder(errorCode);
    for(ConditionalCE32 *cond = head;; cond = getConditionalCE32(cond->next)) {
        // After the list head, the prefix or suffix can be empty, but not both.
        U_ASSERT(cond == head || cond->hasContext());
        int32_t prefixLength = cond->prefixLength();
        UnicodeString prefix(cond->context, 0, prefixLength + 1);
        // Collect all contraction suffixes for one prefix.
        ConditionalCE32 *firstCond = cond;
        ConditionalCE32 *lastCond = cond;
        while(cond->next >= 0 &&
                (cond = getConditionalCE32(cond->next))->context.startsWith(prefix)) {
            lastCond = cond;
        }
        uint32_t ce32;
        int32_t suffixStart = prefixLength + 1;  // == prefix.length()
        if(lastCond->context.length() == suffixStart) {
            // One prefix without contraction suffix.
            U_ASSERT(firstCond == lastCond);
            ce32 = lastCond->ce32;
            cond = lastCond;
        } else {
            // Build the contractions trie.
            contractionBuilder.clear();
            // Entry for an empty suffix, to be stored before the trie.
            uint32_t emptySuffixCE32 = 0;
            uint32_t flags = 0;
            if(firstCond->context.length() == suffixStart) {
                // There is a mapping for the prefix and the single character c. (p|c)
                // If no other suffix matches, then we return this value.
                emptySuffixCE32 = firstCond->ce32;
                cond = getConditionalCE32(firstCond->next);
            } else {
                // There is no mapping for the prefix and just the single character.
                // (There is no p|c, only p|cd, p|ce etc.)
                flags |= Collation::CONTRACT_SINGLE_CP_NO_MATCH;
                // When the prefix matches but none of the prefix-specific suffixes,
                // then we fall back to the mappings with the next-longest prefix,
                // and ultimately to mappings with no prefix.
                // Each fallback might be another set of contractions.
                // For example, if there are mappings for ch, p|cd, p|ce, but not for p|c,
                // then in text "pch" we find the ch contraction.
                for(cond = head;; cond = getConditionalCE32(cond->next)) {
                    int32_t length = cond->prefixLength();
                    if(length == prefixLength) { break; }
                    if(cond->defaultCE32 != Collation::NO_CE32 &&
                            (length==0 || prefix.endsWith(cond->context, 1, length))) {
                        emptySuffixCE32 = cond->defaultCE32;
                    }
                }
                cond = firstCond;
            }
            // Optimization: Set a flag when
            // the first character of every contraction suffix has lccc!=0.
            // Short-circuits contraction matching when a normal letter follows.
            flags |= Collation::CONTRACT_NEXT_CCC;
            // Add all of the non-empty suffixes into the contraction trie.
            for(;;) {
                UnicodeString suffix(cond->context, suffixStart);
                uint16_t fcd16 = nfcImpl.getFCD16(suffix.char32At(0));
                if(fcd16 <= 0xff) {
                    flags &= ~Collation::CONTRACT_NEXT_CCC;
                }
                fcd16 = nfcImpl.getFCD16(suffix.char32At(suffix.length() - 1));
                if(fcd16 > 0xff) {
                    // The last suffix character has lccc!=0, allowing for discontiguous contractions.
                    flags |= Collation::CONTRACT_TRAILING_CCC;
                }
                contractionBuilder.add(suffix, (int32_t)cond->ce32, errorCode);
                if(cond == lastCond) { break; }
                cond = getConditionalCE32(cond->next);
            }
            int32_t index = addContextTrie(emptySuffixCE32, contractionBuilder, errorCode);
            if(U_FAILURE(errorCode)) { return 0; }
            if(index > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            ce32 = Collation::makeCE32FromTagAndIndex(Collation::CONTRACTION_TAG, index) | flags;
        }
        U_ASSERT(cond == lastCond);
        firstCond->defaultCE32 = ce32;
        if(prefixLength == 0) {
            if(cond->next < 0) {
                // No non-empty prefixes, only contractions.
                return ce32;
            }
        } else {
            prefix.remove(0, 1);  // Remove the length unit.
            prefix.reverse();
            prefixBuilder.add(prefix, (int32_t)ce32, errorCode);
            if(cond->next < 0) { break; }
        }
    }
    U_ASSERT(head->defaultCE32 != Collation::NO_CE32);
    int32_t index = addContextTrie(head->defaultCE32, prefixBuilder, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    if(index > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    return Collation::makeCE32FromTagAndIndex(Collation::PREFIX_TAG, index);
}